

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O1

void test_pre_g_table(secp256k1_ge_storage *pre_g,size_t n)

{
  secp256k1_fe *psVar1;
  int *piVar2;
  int iVar3;
  bool bVar4;
  uint64_t uVar5;
  int iVar6;
  undefined4 extraout_EAX;
  uint32_t uVar7;
  long lVar8;
  uint count;
  uint uVar9;
  ulong uVar10;
  secp256k1_ge *psVar11;
  ulong uVar12;
  ulong uVar13;
  secp256k1_ge *a;
  ulong uVar14;
  secp256k1_ge *psVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  byte bVar19;
  undefined1 auVar20 [16];
  secp256k1_ge gg;
  secp256k1_ge p;
  secp256k1_ge q;
  secp256k1_gej g2;
  undefined1 local_2e8 [56];
  ulong uStack_2b0;
  ulong local_2a8;
  ulong uStack_2a0;
  ulong local_298;
  ulong local_290;
  secp256k1_ge local_288;
  secp256k1_ge_storage *local_220;
  undefined1 local_218 [56];
  uint64_t uStack_1e0;
  uint64_t local_1d8;
  uint64_t uStack_1d0;
  uint64_t local_1c8;
  int local_1c0;
  secp256k1_ge local_1a8;
  secp256k1_ge local_138;
  secp256k1_gej local_c8;
  
  bVar19 = 0;
  psVar15 = &local_1a8;
  local_220 = pre_g;
  secp256k1_ge_from_storage(psVar15,pre_g);
  iVar6 = secp256k1_ge_is_valid_var(psVar15);
  if (iVar6 != 0) {
    secp256k1_gej_set_ge(&local_c8,&local_1a8);
    secp256k1_gej_double_var(&local_c8,&local_c8,(secp256k1_fe *)0x0);
    secp256k1_ge_set_gej_var((secp256k1_ge *)local_218,&local_c8);
    local_288._96_8_ = 0x40;
    while( true ) {
      a = (secp256k1_ge *)(local_218 + 0x30);
      secp256k1_fe_verify(&local_1a8.x);
      psVar11 = (secp256k1_ge *)0x1;
      secp256k1_fe_verify_magnitude(&local_1a8.x,1);
      local_2e8._0_8_ = 0x3ffffbfffff0bc - local_1a8.x.n[0];
      local_2e8._8_8_ = 0x3ffffffffffffc - local_1a8.x.n[1];
      local_2e8._16_8_ = 0x3ffffffffffffc - local_1a8.x.n[2];
      local_2e8._24_8_ = 0x3ffffffffffffc - local_1a8.x.n[3];
      local_2e8._32_8_ = 0x3fffffffffffc - local_1a8.x.n[4];
      local_2e8._40_4_ = 2;
      local_2e8._44_4_ = 0;
      secp256k1_fe_verify((secp256k1_fe *)local_2e8);
      secp256k1_fe_verify((secp256k1_fe *)local_2e8);
      psVar15 = (secp256k1_ge *)local_218;
      secp256k1_fe_verify((secp256k1_fe *)psVar15);
      if (0x20 < (int)(local_218._40_4_ + local_2e8._40_4_)) break;
      local_2e8._0_8_ = local_2e8._0_8_ + local_218._0_8_;
      local_2e8._8_8_ = local_2e8._8_8_ + local_218._8_8_;
      local_2e8._16_8_ = local_2e8._16_8_ + local_218._16_8_;
      local_2e8._24_8_ = local_2e8._24_8_ + local_218._24_8_;
      local_2e8._32_8_ = local_2e8._32_8_ + local_218._32_8_;
      local_2e8._44_4_ = 0;
      local_2e8._40_4_ = local_218._40_4_ + local_2e8._40_4_;
      secp256k1_fe_verify((secp256k1_fe *)local_2e8);
      secp256k1_fe_verify((secp256k1_fe *)local_2e8);
      local_2e8._0_8_ = ((ulong)local_2e8._32_8_ >> 0x30) * 0x1000003d1 + local_2e8._0_8_;
      local_2e8._8_8_ = ((ulong)local_2e8._0_8_ >> 0x34) + local_2e8._8_8_;
      local_2e8._16_8_ = ((ulong)local_2e8._8_8_ >> 0x34) + local_2e8._16_8_;
      uVar13 = ((ulong)local_2e8._16_8_ >> 0x34) + local_2e8._24_8_;
      local_2e8._24_8_ = uVar13 & 0xfffffffffffff;
      local_2e8._32_8_ = (uVar13 >> 0x34) + (local_2e8._32_8_ & 0xffffffffffff);
      local_2e8._16_8_ = local_2e8._16_8_ & 0xfffffffffffff;
      local_2e8._8_8_ = local_2e8._8_8_ & 0xfffffffffffff;
      local_2e8._0_8_ = local_2e8._0_8_ & 0xfffffffffffff;
      local_2e8._40_4_ = 1;
      secp256k1_fe_verify((secp256k1_fe *)local_2e8);
      secp256k1_fe_verify(&local_1a8.y);
      psVar11 = (secp256k1_ge *)0x1;
      secp256k1_fe_verify_magnitude(&local_1a8.y,1);
      local_2e8._48_8_ = 0x3ffffbfffff0bc - local_1a8.y.n[0];
      uStack_2b0 = 0x3ffffffffffffc - local_1a8.y.n[1];
      local_2a8 = 0x3ffffffffffffc - local_1a8.y.n[2];
      uStack_2a0 = 0x3ffffffffffffc - local_1a8.y.n[3];
      local_298 = 0x3fffffffffffc - local_1a8.y.n[4];
      local_290._0_4_ = 2;
      local_290._4_4_ = 0;
      psVar1 = (secp256k1_fe *)(local_2e8 + 0x30);
      secp256k1_fe_verify(psVar1);
      secp256k1_fe_verify(psVar1);
      secp256k1_fe_verify((secp256k1_fe *)a);
      psVar15 = a;
      if (0x20 < local_1c0 + (int)local_290) goto LAB_0014f663;
      local_2e8._48_8_ = local_2e8._48_8_ + local_218._48_8_;
      uStack_2b0 = uStack_2b0 + uStack_1e0;
      local_2a8 = local_2a8 + local_1d8;
      uStack_2a0 = uStack_2a0 + uStack_1d0;
      local_298 = local_298 + local_1c8;
      local_290 = (ulong)(uint)(local_1c0 + (int)local_290);
      secp256k1_fe_verify(psVar1);
      secp256k1_fe_verify(psVar1);
      local_2e8._48_8_ = (local_298 >> 0x30) * 0x1000003d1 + local_2e8._48_8_;
      uStack_2b0 = ((ulong)local_2e8._48_8_ >> 0x34) + uStack_2b0;
      local_2a8 = (uStack_2b0 >> 0x34) + local_2a8;
      uVar13 = (local_2a8 >> 0x34) + uStack_2a0;
      uStack_2a0 = uVar13 & 0xfffffffffffff;
      local_298 = (uVar13 >> 0x34) + (local_298 & 0xffffffffffff);
      local_2a8 = local_2a8 & 0xfffffffffffff;
      uStack_2b0 = uStack_2b0 & 0xfffffffffffff;
      local_2e8._48_8_ = local_2e8._48_8_ & 0xfffffffffffff;
      local_290 = CONCAT44(local_290._4_4_,1);
      secp256k1_fe_verify(psVar1);
      secp256k1_fe_verify((secp256k1_fe *)local_2e8);
      uVar13 = ((ulong)local_2e8._32_8_ >> 0x30) * 0x1000003d1 + local_2e8._0_8_;
      if (((uVar13 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar13 & 0xfffffffffffff) == 0)) {
        uVar10 = (uVar13 >> 0x34) + local_2e8._8_8_;
        uVar12 = (uVar10 >> 0x34) + local_2e8._16_8_;
        uVar14 = (uVar12 >> 0x34) + local_2e8._24_8_;
        uVar16 = (uVar14 >> 0x34) + (local_2e8._32_8_ & 0xffffffffffff);
        if ((((uVar10 | uVar13 | uVar12 | uVar14) & 0xfffffffffffff) != 0 || uVar16 != 0) &&
           ((uVar13 + 0x1000003d0 & uVar10 & uVar12 & uVar14 & (uVar16 ^ 0xf000000000000)) !=
            0xfffffffffffff)) goto LAB_0014f267;
        secp256k1_fe_verify(psVar1);
        uVar13 = (local_298 >> 0x30) * 0x1000003d1 + local_2e8._48_8_;
        if (((uVar13 & 0xfffffffffffff) != 0xffffefffffc2f) && ((uVar13 & 0xfffffffffffff) != 0))
        goto LAB_0014f267;
        uVar10 = (uVar13 >> 0x34) + uStack_2b0;
        pre_g = (secp256k1_ge_storage *)((uVar10 >> 0x34) + local_2a8);
        psVar15 = (secp256k1_ge *)(((ulong)pre_g >> 0x34) + uStack_2a0);
        uVar12 = ((ulong)psVar15 >> 0x34) + (local_298 & 0xffffffffffff);
        if ((((uVar10 | uVar13 | (ulong)pre_g | (ulong)psVar15) & 0xfffffffffffff) != 0 ||
             uVar12 != 0) &&
           ((uVar13 + 0x1000003d0 & uVar10 & (ulong)pre_g & (ulong)psVar15 &
            (uVar12 ^ 0xf000000000000)) != 0xfffffffffffff)) goto LAB_0014f267;
        goto LAB_0014f681;
      }
LAB_0014f267:
      psVar11 = (secp256k1_ge *)((long)(local_220->x).n + local_288._96_8_);
      secp256k1_ge_from_storage(&local_138,(secp256k1_ge_storage *)psVar11);
      psVar15 = &local_138;
      iVar6 = secp256k1_ge_is_valid_var(&local_138);
      if (iVar6 == 0) goto LAB_0014f668;
      secp256k1_fe_verify(&local_138.x);
      psVar11 = (secp256k1_ge *)0x1;
      secp256k1_fe_verify_magnitude(&local_138.x,1);
      local_288.y.n[0] = 0x3ffffbfffff0bc - local_138.x.n[0];
      local_288.y.n[1] = 0x3ffffffffffffc - local_138.x.n[1];
      local_288.y.n[2] = 0x3ffffffffffffc - local_138.x.n[2];
      local_288.y.n[3] = 0x3ffffffffffffc - local_138.x.n[3];
      local_288.y.n[4] = 0x3fffffffffffc - local_138.x.n[4];
      local_288.y.magnitude = 2;
      local_288.y.normalized = 0;
      psVar1 = &local_288.y;
      secp256k1_fe_verify(psVar1);
      secp256k1_fe_verify(psVar1);
      psVar15 = (secp256k1_ge *)local_218;
      secp256k1_fe_verify((secp256k1_fe *)psVar15);
      if (0x20 < local_218._40_4_ + local_288.y.magnitude) goto LAB_0014f66d;
      local_288.y.n[0] = local_288.y.n[0] + local_218._0_8_;
      local_288.y.n[1] = local_288.y.n[1] + local_218._8_8_;
      local_288.y.n[2] = local_288.y.n[2] + local_218._16_8_;
      local_288.y.n[3] = local_288.y.n[3] + local_218._24_8_;
      local_288.y.n[4] = local_288.y.n[4] + local_218._32_8_;
      local_288.y.normalized = 0;
      local_288.y.magnitude = local_218._40_4_ + local_288.y.magnitude;
      secp256k1_fe_verify(psVar1);
      local_288.x.n[4] = local_138.y.n[4];
      local_288.x.magnitude = local_138.y.magnitude;
      local_288.x.normalized = local_138.y.normalized;
      local_288.x.n[2] = local_138.y.n[2];
      local_288.x.n[3] = local_138.y.n[3];
      local_288.x.n[0] = local_138.y.n[0];
      local_288.x.n[1] = local_138.y.n[1];
      secp256k1_fe_verify(&local_288.x);
      psVar15 = (secp256k1_ge *)(local_218 + 0x30);
      secp256k1_fe_verify((secp256k1_fe *)psVar15);
      if (0x20 < local_1c0 + local_288.x.magnitude) goto LAB_0014f672;
      local_288.x.n[0] = local_288.x.n[0] + local_218._48_8_;
      local_288.x.n[1] = local_288.x.n[1] + uStack_1e0;
      local_288.x.n[2] = local_288.x.n[2] + local_1d8;
      local_288.x.n[3] = local_288.x.n[3] + uStack_1d0;
      local_288.x.n[4] = local_288.x.n[4] + local_1c8;
      local_288.x.normalized = 0;
      local_288.x.magnitude = local_1c0 + local_288.x.magnitude;
      secp256k1_fe_verify(&local_288.x);
      secp256k1_fe_verify(psVar1);
      uVar13 = (local_288.y.n[4] >> 0x30) * 0x1000003d1 + local_288.y.n[0];
      if (((uVar13 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar13 & 0xfffffffffffff) == 0)) {
        uVar10 = (uVar13 >> 0x34) + local_288.y.n[1];
        uVar12 = (uVar10 >> 0x34) + local_288.y.n[2];
        uVar14 = (uVar12 >> 0x34) + local_288.y.n[3];
        uVar16 = (uVar14 >> 0x34) + (local_288.y.n[4] & 0xffffffffffff);
        if ((((uVar10 | uVar13 | uVar12 | uVar14) & 0xfffffffffffff) != 0 || uVar16 != 0) &&
           ((uVar13 + 0x1000003d0 & uVar10 & uVar12 & uVar14 & (uVar16 ^ 0xf000000000000)) !=
            0xfffffffffffff)) goto LAB_0014f5b4;
        secp256k1_fe_verify(&local_288.x);
        uVar13 = (local_288.x.n[4] >> 0x30) * 0x1000003d1 + local_288.x.n[0];
        if (((uVar13 & 0xfffffffffffff) != 0xffffefffffc2f) && ((uVar13 & 0xfffffffffffff) != 0))
        goto LAB_0014f5b4;
        uVar10 = (uVar13 >> 0x34) + local_288.x.n[1];
        pre_g = (secp256k1_ge_storage *)((uVar10 >> 0x34) + local_288.x.n[2]);
        psVar15 = (secp256k1_ge *)(((ulong)pre_g >> 0x34) + local_288.x.n[3]);
        uVar12 = ((ulong)psVar15 >> 0x34) + (local_288.x.n[4] & 0xffffffffffff);
        if ((((uVar10 | uVar13 | (ulong)pre_g | (ulong)psVar15) & 0xfffffffffffff) != 0 ||
             uVar12 != 0) &&
           ((uVar13 + 0x1000003d0 & uVar10 & (ulong)pre_g & (ulong)psVar15 &
            (uVar12 ^ 0xf000000000000)) != 0xfffffffffffff)) goto LAB_0014f5b4;
        goto LAB_0014f686;
      }
LAB_0014f5b4:
      iVar6 = secp256k1_fe_equal((secp256k1_fe *)local_2e8,psVar1);
      psVar11 = (secp256k1_ge *)(local_2e8 + 0x30);
      if ((iVar6 != 0) &&
         (pre_g = (secp256k1_ge_storage *)&local_288, psVar15 = psVar11,
         iVar6 = secp256k1_fe_equal((secp256k1_fe *)psVar11,&local_288.x), iVar6 != 0))
      goto LAB_0014f67c;
      secp256k1_fe_mul((secp256k1_fe *)local_2e8,(secp256k1_fe *)local_2e8,&local_288.x);
      secp256k1_fe_mul((secp256k1_fe *)psVar11,(secp256k1_fe *)psVar11,&local_288.y);
      psVar15 = (secp256k1_ge *)local_2e8;
      iVar6 = secp256k1_fe_equal((secp256k1_fe *)local_2e8,(secp256k1_fe *)psVar11);
      if (iVar6 == 0) goto LAB_0014f677;
      psVar15 = &local_138;
      psVar11 = &local_1a8;
      for (lVar8 = 0xd; lVar8 != 0; lVar8 = lVar8 + -1) {
        (psVar11->x).n[0] = (psVar15->x).n[0];
        psVar15 = (secp256k1_ge *)((long)psVar15 + ((ulong)bVar19 * -2 + 1) * 8);
        psVar11 = (secp256k1_ge *)((long)psVar11 + ((ulong)bVar19 * -2 + 1) * 8);
      }
      local_288._96_8_ = local_288._96_8_ + 0x40;
      if (local_288._96_8_ == 0x80000) {
        return;
      }
    }
    test_pre_g_table_cold_9();
LAB_0014f663:
    test_pre_g_table_cold_8();
LAB_0014f668:
    test_pre_g_table_cold_7();
LAB_0014f66d:
    test_pre_g_table_cold_6();
LAB_0014f672:
    test_pre_g_table_cold_5();
LAB_0014f677:
    test_pre_g_table_cold_4();
    pre_g = (secp256k1_ge_storage *)psVar11;
LAB_0014f67c:
    test_pre_g_table_cold_3();
LAB_0014f681:
    test_pre_g_table_cold_1();
LAB_0014f686:
    test_pre_g_table_cold_2();
  }
  test_pre_g_table_cold_10();
  secp256k1_scalar_verify((secp256k1_scalar *)pre_g);
  auVar20._0_4_ =
       -(uint)((int)(((secp256k1_ge *)pre_g)->x).n[2] == 0 &&
              (int)(((secp256k1_ge *)pre_g)->x).n[0] == 0);
  auVar20._4_4_ =
       -(uint)(*(int *)((long)(((secp256k1_ge *)pre_g)->x).n + 0x14) == 0 &&
              *(int *)((long)(((secp256k1_ge *)pre_g)->x).n + 4) == 0);
  auVar20._8_4_ =
       -(uint)((int)(((secp256k1_ge *)pre_g)->x).n[3] == 0 &&
              (int)(((secp256k1_ge *)pre_g)->x).n[1] == 0);
  auVar20._12_4_ =
       -(uint)(*(int *)((long)(((secp256k1_ge *)pre_g)->x).n + 0x1c) == 0 &&
              *(int *)((long)(((secp256k1_ge *)pre_g)->x).n + 0xc) == 0);
  iVar6 = movmskps(extraout_EAX,auVar20);
  if (iVar6 == 0xf) {
    if (-1 < (int)(0x7f / (long)(int)count)) {
      memset(psVar15,0,(0x7f / (long)(int)count & 0xffffffffU) * 4 + 4);
    }
  }
  else {
    secp256k1_scalar_verify((secp256k1_scalar *)pre_g);
    uVar5 = (((secp256k1_ge *)pre_g)->x).n[0];
    uVar7 = secp256k1_scalar_get_bits_var((secp256k1_scalar *)pre_g,0,count);
    *(uint32_t *)(psVar15->x).n = uVar7 + (~(uint)uVar5 & 1);
    iVar6 = (int)(0x7f / (long)(int)count);
    uVar17 = iVar6 * count;
    uVar18 = 0x80 - uVar17;
    uVar13 = 0x7f / (long)(int)count & 0xffffffff;
    if (0 < iVar6) {
      lVar8 = 0;
      uVar10 = uVar13;
      do {
        uVar9 = count;
        if (lVar8 == 0) {
          uVar9 = uVar18;
        }
        uVar7 = secp256k1_scalar_get_bits_var((secp256k1_scalar *)pre_g,uVar17,uVar9);
        if (uVar7 != 0) goto LAB_0014f765;
        *(undefined4 *)((long)(psVar15->x).n + uVar10 * 4) = 0;
        uVar17 = uVar17 - count;
        lVar8 = lVar8 + 1;
        bVar4 = 1 < (long)uVar10;
        uVar10 = uVar10 - 1;
      } while (bVar4);
      uVar10 = 0;
LAB_0014f765:
      iVar6 = (int)uVar10;
    }
    if (0 < iVar6) {
      uVar10 = 1;
      uVar17 = count;
      do {
        uVar9 = count;
        if (uVar13 == uVar10) {
          uVar9 = uVar18;
        }
        uVar7 = secp256k1_scalar_get_bits_var((secp256k1_scalar *)pre_g,uVar17,uVar9);
        if ((uVar7 & 1) == 0) {
          piVar2 = (int *)((long)(psVar15->x).n + uVar10 * 4 + -4);
          *piVar2 = *piVar2 + (-1 << ((byte)count & 0x1f));
          uVar7 = uVar7 | 1;
        }
        *(uint32_t *)((long)(psVar15->x).n + uVar10 * 4) = uVar7;
        if ((1 < uVar10) &&
           (((iVar3 = *(int *)((long)(psVar15->x).n + uVar10 * 4 + -4), iVar3 == 1 &&
             (*(int *)((long)(psVar15->x).n + uVar10 * 4 + -8) < 0)) ||
            ((iVar3 == -1 && (0 < *(int *)((long)(psVar15->x).n + uVar10 * 4 + -8))))))) {
          piVar2 = (int *)((long)(psVar15->x).n + uVar10 * 4 + -8);
          *piVar2 = *piVar2 + ((uint)(iVar3 == 1) * 2 + -1 << ((byte)count & 0x1f));
          *(undefined4 *)((long)(psVar15->x).n + uVar10 * 4 + -4) = 0;
        }
        uVar10 = uVar10 + 1;
        uVar17 = uVar17 + count;
      } while (iVar6 + 1 != uVar10);
    }
  }
  return;
}

Assistant:

static void test_pre_g_table(const secp256k1_ge_storage * pre_g, size_t n) {
    /* Tests the pre_g / pre_g_128 tables for consistency.
     * For independent verification we take a "geometric" approach to verification.
     * We check that every entry is on-curve.
     * We check that for consecutive entries p and q, that p + gg - q = 0 by checking
     *  (1) p, gg, and -q are colinear.
     *  (2) p, gg, and -q are all distinct.
     * where gg is twice the generator, where the generator is the first table entry.
     *
     * Checking the table's generators are correct is done in run_ecmult_pre_g.
     */
    secp256k1_gej g2;
    secp256k1_ge p, q, gg;
    secp256k1_fe dpx, dpy, dqx, dqy;
    size_t i;

    CHECK(0 < n);

    secp256k1_ge_from_storage(&p, &pre_g[0]);
    CHECK(secp256k1_ge_is_valid_var(&p));

    secp256k1_gej_set_ge(&g2, &p);
    secp256k1_gej_double_var(&g2, &g2, NULL);
    secp256k1_ge_set_gej_var(&gg, &g2);
    for (i = 1; i < n; ++i) {
        secp256k1_fe_negate(&dpx, &p.x, 1); secp256k1_fe_add(&dpx, &gg.x); secp256k1_fe_normalize_weak(&dpx);
        secp256k1_fe_negate(&dpy, &p.y, 1); secp256k1_fe_add(&dpy, &gg.y); secp256k1_fe_normalize_weak(&dpy);
        /* Check that p is not equal to gg */
        CHECK(!secp256k1_fe_normalizes_to_zero_var(&dpx) || !secp256k1_fe_normalizes_to_zero_var(&dpy));

        secp256k1_ge_from_storage(&q, &pre_g[i]);
        CHECK(secp256k1_ge_is_valid_var(&q));

        secp256k1_fe_negate(&dqx, &q.x, 1); secp256k1_fe_add(&dqx, &gg.x);
        dqy = q.y; secp256k1_fe_add(&dqy, &gg.y);
        /* Check that -q is not equal to gg */
        CHECK(!secp256k1_fe_normalizes_to_zero_var(&dqx) || !secp256k1_fe_normalizes_to_zero_var(&dqy));

        /* Check that -q is not equal to p */
        CHECK(!secp256k1_fe_equal(&dpx, &dqx) || !secp256k1_fe_equal(&dpy, &dqy));

        /* Check that p, -q and gg are colinear */
        secp256k1_fe_mul(&dpx, &dpx, &dqy);
        secp256k1_fe_mul(&dpy, &dpy, &dqx);
        CHECK(secp256k1_fe_equal(&dpx, &dpy));

        p = q;
    }
}